

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O0

void __thiscall plot::detail::braille::image_t::paint(image_t *this,image_t *other,TerminalOp op)

{
  bool bVar1;
  pointer this_00;
  reference pbVar2;
  block_t local_4c;
  __normal_iterator<const_plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
  local_38;
  const_iterator src_end;
  const_iterator src;
  iterator dst;
  TerminalOp op_local;
  image_t *other_local;
  image_t *this_local;
  
  src._M_current =
       (block_t *)
       std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ::begin(&this->
                super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
              );
  src_end = std::
            vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
            ::begin(&other->
                     super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                   );
  local_38._M_current =
       (block_t *)
       std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ::end(&other->
              super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
            );
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&src_end,&local_38);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
              ::operator->(&src_end);
    pbVar2 = __gnu_cxx::
             __normal_iterator<plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
             ::operator*((__normal_iterator<plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
                          *)&src);
    block_t::paint(&local_4c,this_00,pbVar2,op);
    pbVar2 = __gnu_cxx::
             __normal_iterator<plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
             ::operator*((__normal_iterator<plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
                          *)&src);
    (pbVar2->color).r = local_4c.color.r;
    (pbVar2->color).g = local_4c.color.g;
    (pbVar2->color).b = local_4c.color.b;
    (pbVar2->color).a = local_4c.color.a;
    pbVar2->pixels = local_4c.pixels;
    __gnu_cxx::
    __normal_iterator<const_plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
    ::operator++(&src_end);
    __gnu_cxx::
    __normal_iterator<plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
    ::operator++((__normal_iterator<plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
                  *)&src);
  }
  return;
}

Assistant:

void paint(image_t const& other, TerminalOp op) {
            auto dst = begin();
            for (auto src = other.begin(), src_end = other.end(); src != src_end; ++src, ++dst)
                *dst = src->paint(*dst, op);
        }